

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_newc.c
# Opt level: O0

int is_hex(char *p,size_t l)

{
  size_t l_local;
  char *p_local;
  
  l_local = l;
  p_local = p;
  while( true ) {
    if (l_local == 0) {
      return 1;
    }
    if ((((*p_local < '0') || ('9' < *p_local)) && ((*p_local < 'a' || ('f' < *p_local)))) &&
       ((*p_local < 'A' || ('F' < *p_local)))) break;
    l_local = l_local - 1;
    p_local = p_local + 1;
  }
  return 0;
}

Assistant:

static int
is_hex(const char *p, size_t l)
{
	while (l > 0) {
		if ((*p >= '0' && *p <= '9')
		    || (*p >= 'a' && *p <= 'f')
		    || (*p >= 'A' && *p <= 'F'))
		{
			--l;
			++p;
		} else
			return (0);

	}
	return (1);
}